

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O3

void __thiscall SQLite::Statement::Ptr::~Ptr(Ptr *this)

{
  uint *puVar1;
  uint uVar2;
  
  puVar1 = this->mpRefCount;
  if (puVar1 == (uint *)0x0) {
    __assert_fail("NULL != mpRefCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ingjieye[P]telegram-shadowsocks-manager-bot/lib/SQLiteCpp/src/Statement.cpp"
                  ,0x1be,"SQLite::Statement::Ptr::~Ptr()");
  }
  if (*puVar1 != 0) {
    uVar2 = *puVar1 - 1;
    *puVar1 = uVar2;
    if (uVar2 == 0) {
      sqlite3_finalize(this->mpStmt);
      operator_delete(this->mpRefCount,4);
      this->mpStmt = (sqlite3_stmt *)0x0;
      this->mpRefCount = (uint *)0x0;
    }
    return;
  }
  __assert_fail("0 != *mpRefCount",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ingjieye[P]telegram-shadowsocks-manager-bot/lib/SQLiteCpp/src/Statement.cpp"
                ,0x1bf,"SQLite::Statement::Ptr::~Ptr()");
}

Assistant:

Statement::Ptr::~Ptr()
{
    assert(NULL != mpRefCount);
    assert(0 != *mpRefCount);

    // Decrement and check the reference counter of the sqlite3_stmt
    --(*mpRefCount);
    if (0 == *mpRefCount)
    {
        // If count reaches zero, finalize the sqlite3_stmt, as no Statement nor Column objet use it anymore.
        // No need to check the return code, as it is the same as the last statement evaluation.
        sqlite3_finalize(mpStmt);

        // and delete the reference counter
        delete mpRefCount;
        mpRefCount = NULL;
        mpStmt = NULL;
    }
    // else, the finalization will be done later, by the last object
}